

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragBehavior(ImGuiID id,ImGuiDataType data_type,void *p_v,float v_speed,void *p_min,
                        void *p_max,char *format,float power,ImGuiDragFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  double dVar5;
  int iVar6;
  uint uVar7;
  unsigned_long_long v_min;
  longlong v_min_00;
  float fVar8;
  float v_max;
  double v_max_00;
  ImS32 v32;
  uint local_4c;
  float local_48;
  float local_44;
  double *local_40;
  double *local_38;
  
  pIVar1 = GImGui;
  if (GImGui->ActiveId == id) {
    if (GImGui->ActiveIdSource == ImGuiInputSource_Nav) {
      if ((GImGui->NavActivatePressedId == id) && (GImGui->ActiveIdIsJustActivated == false))
      goto LAB_00255191;
    }
    else if ((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
            ((GImGui->IO).MouseDown[0] != true)) {
LAB_00255191:
      local_48 = v_speed;
      local_44 = power;
      local_40 = (double *)p_max;
      local_38 = (double *)p_v;
      ClearActiveID();
      p_v = local_38;
      p_max = local_40;
      v_speed = local_48;
      power = local_44;
    }
  }
  if (pIVar1->ActiveId != id) {
LAB_00255206:
    return false;
  }
  switch(data_type) {
  case 0:
    local_4c = (uint)*p_v;
    if (p_min == (void *)0x0) {
      iVar6 = -0x80;
    }
    else {
      iVar6 = (int)*p_min;
    }
    if ((double *)p_max == (double *)0x0) {
      iVar3 = 0x7f;
    }
    else {
      iVar3 = (int)(char)*p_max;
    }
    bVar2 = DragBehaviorT<int,int,float>(4,(int *)&local_4c,v_speed,iVar6,iVar3,format,power,flags);
    break;
  case 1:
    local_4c = (uint)*p_v;
    if (p_min == (void *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = (uint)*p_min;
    }
    if ((double *)p_max == (double *)0x0) {
      uVar4 = 0xff;
    }
    else {
      uVar4 = (uint)*p_max;
    }
    bVar2 = DragBehaviorT<unsigned_int,int,float>
                      (5,&local_4c,v_speed,uVar7,uVar4,format,power,flags);
    break;
  case 2:
    local_4c = (uint)*p_v;
    if (p_min == (void *)0x0) {
      iVar6 = -0x8000;
    }
    else {
      iVar6 = (int)*p_min;
    }
    if ((double *)p_max == (double *)0x0) {
      iVar3 = 0x7fff;
    }
    else {
      iVar3 = (int)(short)*p_max;
    }
    bVar2 = DragBehaviorT<int,int,float>(4,(int *)&local_4c,v_speed,iVar6,iVar3,format,power,flags);
    goto LAB_002553a5;
  case 3:
    local_4c = (uint)*p_v;
    if (p_min == (void *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = (uint)*p_min;
    }
    if ((double *)p_max == (double *)0x0) {
      uVar4 = 0xffff;
    }
    else {
      uVar4 = (uint)*p_max;
    }
    bVar2 = DragBehaviorT<unsigned_int,int,float>
                      (5,&local_4c,v_speed,uVar7,uVar4,format,power,flags);
LAB_002553a5:
    if (bVar2 == false) {
      return false;
    }
    *(undefined2 *)p_v = (undefined2)local_4c;
    return bVar2;
  case 4:
    if (p_min == (void *)0x0) {
      iVar6 = -0x80000000;
    }
    else {
      iVar6 = *p_min;
    }
    if ((double *)p_max == (double *)0x0) {
      fVar8 = NAN;
    }
    else {
      fVar8 = *p_max;
    }
    bVar2 = DragBehaviorT<int,int,float>(4,(int *)p_v,v_speed,iVar6,(int)fVar8,format,power,flags);
    return bVar2;
  case 5:
    if (p_min == (void *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *p_min;
    }
    if ((double *)p_max == (double *)0x0) {
      fVar8 = -NAN;
    }
    else {
      fVar8 = *p_max;
    }
    bVar2 = DragBehaviorT<unsigned_int,int,float>
                      (5,(uint *)p_v,v_speed,uVar7,(uint)fVar8,format,power,flags);
    return bVar2;
  case 6:
    dVar5 = NAN;
    if (p_min == (void *)0x0) {
      v_min_00 = -0x8000000000000000;
    }
    else {
      v_min_00 = *p_min;
    }
    if ((double *)p_max != (double *)0x0) {
      dVar5 = *p_max;
    }
    bVar2 = DragBehaviorT<long_long,long_long,double>
                      (6,(longlong *)p_v,v_speed,v_min_00,(longlong)dVar5,format,power,flags);
    return bVar2;
  case 7:
    if (p_min == (void *)0x0) {
      v_min = 0;
    }
    else {
      v_min = *p_min;
    }
    if ((double *)p_max == (double *)0x0) {
      dVar5 = -NAN;
    }
    else {
      dVar5 = *p_max;
    }
    bVar2 = DragBehaviorT<unsigned_long_long,long_long,double>
                      (7,(unsigned_long_long *)p_v,v_speed,v_min,(unsigned_long_long)dVar5,format,
                       power,flags);
    return bVar2;
  case 8:
    if (p_min == (void *)0x0) {
      fVar8 = -3.4028235e+38;
    }
    else {
      fVar8 = *p_min;
    }
    if ((double *)p_max == (double *)0x0) {
      v_max = 3.4028235e+38;
    }
    else {
      v_max = *p_max;
    }
    bVar2 = DragBehaviorT<float,float,float>(8,(float *)p_v,v_speed,fVar8,v_max,format,power,flags);
    return bVar2;
  case 9:
    if (p_min == (void *)0x0) {
      dVar5 = -1.79769313486232e+308;
    }
    else {
      dVar5 = *p_min;
    }
    if ((double *)p_max == (double *)0x0) {
      v_max_00 = 1.79769313486232e+308;
    }
    else {
      v_max_00 = *p_max;
    }
    bVar2 = DragBehaviorT<double,double,double>
                      (9,(double *)p_v,v_speed,dVar5,v_max_00,format,power,flags);
    return bVar2;
  default:
    goto LAB_00255206;
  }
  if (bVar2 != false) {
    *(undefined1 *)p_v = (undefined1)local_4c;
  }
  return bVar2;
}

Assistant:

bool ImGui::DragBehavior(ImGuiID id, ImGuiDataType data_type, void* p_v, float v_speed, const void* p_min, const void* p_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse && !g.IO.MouseDown[0])
            ClearActiveID();
        else if (g.ActiveIdSource == ImGuiInputSource_Nav && g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            ClearActiveID();
    }
    if (g.ActiveId != id)
        return false;

    switch (data_type)
    {
    case ImGuiDataType_S8:     { ImS32 v32 = (ImS32)*(ImS8*)p_v;  bool r = DragBehaviorT<ImS32, ImS32, float>(ImGuiDataType_S32, &v32, v_speed, p_min ? *(const ImS8*) p_min : IM_S8_MIN,  p_max ? *(const ImS8*)p_max  : IM_S8_MAX,  format, power, flags); if (r) *(ImS8*)p_v = (ImS8)v32; return r; }
    case ImGuiDataType_U8:     { ImU32 v32 = (ImU32)*(ImU8*)p_v;  bool r = DragBehaviorT<ImU32, ImS32, float>(ImGuiDataType_U32, &v32, v_speed, p_min ? *(const ImU8*) p_min : IM_U8_MIN,  p_max ? *(const ImU8*)p_max  : IM_U8_MAX,  format, power, flags); if (r) *(ImU8*)p_v = (ImU8)v32; return r; }
    case ImGuiDataType_S16:    { ImS32 v32 = (ImS32)*(ImS16*)p_v; bool r = DragBehaviorT<ImS32, ImS32, float>(ImGuiDataType_S32, &v32, v_speed, p_min ? *(const ImS16*)p_min : IM_S16_MIN, p_max ? *(const ImS16*)p_max : IM_S16_MAX, format, power, flags); if (r) *(ImS16*)p_v = (ImS16)v32; return r; }
    case ImGuiDataType_U16:    { ImU32 v32 = (ImU32)*(ImU16*)p_v; bool r = DragBehaviorT<ImU32, ImS32, float>(ImGuiDataType_U32, &v32, v_speed, p_min ? *(const ImU16*)p_min : IM_U16_MIN, p_max ? *(const ImU16*)p_max : IM_U16_MAX, format, power, flags); if (r) *(ImU16*)p_v = (ImU16)v32; return r; }
    case ImGuiDataType_S32:    return DragBehaviorT<ImS32, ImS32, float >(data_type, (ImS32*)p_v,  v_speed, p_min ? *(const ImS32* )p_min : IM_S32_MIN, p_max ? *(const ImS32* )p_max : IM_S32_MAX, format, power, flags);
    case ImGuiDataType_U32:    return DragBehaviorT<ImU32, ImS32, float >(data_type, (ImU32*)p_v,  v_speed, p_min ? *(const ImU32* )p_min : IM_U32_MIN, p_max ? *(const ImU32* )p_max : IM_U32_MAX, format, power, flags);
    case ImGuiDataType_S64:    return DragBehaviorT<ImS64, ImS64, double>(data_type, (ImS64*)p_v,  v_speed, p_min ? *(const ImS64* )p_min : IM_S64_MIN, p_max ? *(const ImS64* )p_max : IM_S64_MAX, format, power, flags);
    case ImGuiDataType_U64:    return DragBehaviorT<ImU64, ImS64, double>(data_type, (ImU64*)p_v,  v_speed, p_min ? *(const ImU64* )p_min : IM_U64_MIN, p_max ? *(const ImU64* )p_max : IM_U64_MAX, format, power, flags);
    case ImGuiDataType_Float:  return DragBehaviorT<float, float, float >(data_type, (float*)p_v,  v_speed, p_min ? *(const float* )p_min : -FLT_MAX,   p_max ? *(const float* )p_max : FLT_MAX,    format, power, flags);
    case ImGuiDataType_Double: return DragBehaviorT<double,double,double>(data_type, (double*)p_v, v_speed, p_min ? *(const double*)p_min : -DBL_MAX,   p_max ? *(const double*)p_max : DBL_MAX,    format, power, flags);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return false;
}